

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

AMQP_VALUE amqpvalue_create_received(RECEIVED_HANDLE received)

{
  AMQP_VALUE pAVar1;
  
  if (received != (RECEIVED_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(received->composite_value);
    return pAVar1;
  }
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_create_received(RECEIVED_HANDLE received)
{
    AMQP_VALUE result;

    if (received == NULL)
    {
        result = NULL;
    }
    else
    {
        RECEIVED_INSTANCE* received_instance = (RECEIVED_INSTANCE*)received;
        result = amqpvalue_clone(received_instance->composite_value);
    }

    return result;
}